

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O3

string * __thiscall
Logger::formatError_abi_cxx11_
          (string *__return_storage_ptr__,Logger *this,ErrorType type,char *text)

{
  char *pcVar1;
  size_t sVar2;
  string *fmt;
  undefined4 in_register_00000014;
  char **in_R8;
  string position;
  undefined1 local_68 [8];
  char *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  string local_40;
  
  local_68 = (undefined1  [8])CONCAT44(in_register_00000014,type);
  pcVar1 = local_58._M_local_buf + 8;
  local_58._M_allocated_capacity = 0;
  local_58._M_local_buf[8] = '\0';
  local_60 = pcVar1;
  if (!Global.memoryMode) {
    sVar2 = FileList::size(&Global.fileList);
    if (sVar2 != 0) {
      fmt = FileList::relativeString_abi_cxx11_(&Global.fileList,Global.FileInfo.FileNum);
      tinyformat::format<std::__cxx11::string,int>
                (&local_40,(tinyformat *)"%s(%d) ",(char *)fmt,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Global.FileInfo.LineNumber,(int *)in_R8);
      std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((uint)this < 4) {
    tinyformat::format<std::__cxx11::string,char_const*>
              (__return_storage_ptr__,
               (tinyformat *)
               (&DAT_001898cc + *(int *)(&DAT_001898cc + ((ulong)this & 0xffffffff) * 4)),
               (char *)&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,in_R8);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  if (local_60 != pcVar1) {
    operator_delete(local_60,CONCAT71(local_58._9_7_,local_58._M_local_buf[8]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Logger::formatError(ErrorType type, const char* text)
{
	std::string position;

	if (!Global.memoryMode && Global.fileList.size() > 0)
	{
		const auto& fileName = Global.fileList.relativeString(Global.FileInfo.FileNum);
		position = tfm::format("%s(%d) ", fileName, Global.FileInfo.LineNumber);
	}

	switch (type)
	{
	case Warning:
		return tfm::format("%swarning: %s",position,text);
	case Error:
		return tfm::format("%serror: %s",position,text);
	case FatalError:
		return tfm::format("%sfatal error: %s",position,text);
	case Notice:
		return tfm::format("%snotice: %s",position,text);
	}

	return "";
}